

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

size_t mime_file_read(char *buffer,size_t size,size_t nitems,void *instream)

{
  FILE *pFVar1;
  size_t sVar2;
  
  if (nitems == 0) {
    return 0xfffffffffffffffe;
  }
  if (*(long *)((long)instream + 0x48) == 0) {
    pFVar1 = fopen64(*(char **)((long)instream + 0x20),"rb");
    *(FILE **)((long)instream + 0x48) = pFVar1;
    if (pFVar1 == (FILE *)0x0) {
      return 0xffffffffffffffff;
    }
  }
  sVar2 = fread(buffer,size,nitems,*(FILE **)((long)instream + 0x48));
  return sVar2;
}

Assistant:

static size_t mime_file_read(char *buffer, size_t size, size_t nitems,
                             void *instream)
{
  curl_mimepart *part = (curl_mimepart *) instream;

  if(!nitems)
    return STOP_FILLING;

  if(mime_open_file(part))
    return READ_ERROR;

  return fread(buffer, size, nitems, part->fp);
}